

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O2

int do_x509_check(X509 *x,char *chk,size_t chklen,uint flags,int check_type,char **peername)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  OPENSSL_STACK *sk;
  size_t sVar4;
  int *piVar5;
  X509_NAME *name;
  X509_NAME_ENTRY *ne;
  ASN1_STRING *a;
  size_t i;
  ulong i_00;
  code *equal;
  int local_4c;
  
  iVar3 = 0x16;
  if (check_type == 1) {
    bVar1 = true;
    local_4c = 0x30;
    equal = equal_email;
  }
  else if (check_type == 2) {
    bVar1 = true;
    equal = equal_nocase;
    if ((flags & 2) == 0) {
      equal = equal_wildcard;
    }
    local_4c = 0xd;
  }
  else {
    bVar1 = false;
    iVar3 = 4;
    equal = equal_case;
    local_4c = 0;
  }
  sk = (OPENSSL_STACK *)X509_get_ext_d2i((X509 *)x,0x55,(int *)0x0,(int *)0x0);
  if (sk == (OPENSSL_STACK *)0x0) {
    if (bVar1 && (char)((flags & 0x20) >> 5) == '\0') {
      name = X509_get_subject_name((X509 *)x);
      iVar3 = -1;
      do {
        iVar3 = X509_NAME_get_index_by_NID(name,local_4c,iVar3);
        if (iVar3 < 0) goto LAB_002d9ce2;
        ne = X509_NAME_get_entry(name,iVar3);
        a = X509_NAME_ENTRY_get_data(ne);
        iVar2 = do_check_string((ASN1_STRING *)a,-1,equal,flags,check_type,chk,chklen,peername);
      } while (iVar2 == 0);
    }
    else {
LAB_002d9ce2:
      iVar2 = 0;
    }
  }
  else {
    for (i_00 = 0; sVar4 = OPENSSL_sk_num(sk), i_00 < sVar4; i_00 = i_00 + 1) {
      piVar5 = (int *)OPENSSL_sk_value(sk,i_00);
      if ((*piVar5 == check_type) &&
         (iVar2 = do_check_string(*(ASN1_STRING **)(piVar5 + 2),iVar3,equal,flags,check_type,chk,
                                  chklen,peername), iVar2 != 0)) goto LAB_002d9ce8;
    }
    iVar2 = 0;
LAB_002d9ce8:
    GENERAL_NAMES_free((GENERAL_NAMES *)sk);
  }
  return iVar2;
}

Assistant:

static int do_x509_check(const X509 *x, const char *chk, size_t chklen,
                         unsigned int flags, int check_type, char **peername) {
  int cnid = NID_undef;
  int alt_type;
  int rv = 0;
  equal_fn equal;
  if (check_type == GEN_EMAIL) {
    cnid = NID_pkcs9_emailAddress;
    alt_type = V_ASN1_IA5STRING;
    equal = equal_email;
  } else if (check_type == GEN_DNS) {
    cnid = NID_commonName;
    alt_type = V_ASN1_IA5STRING;
    if (flags & X509_CHECK_FLAG_NO_WILDCARDS) {
      equal = equal_nocase;
    } else {
      equal = equal_wildcard;
    }
  } else {
    alt_type = V_ASN1_OCTET_STRING;
    equal = equal_case;
  }

  GENERAL_NAMES *gens = reinterpret_cast<GENERAL_NAMES *>(
      X509_get_ext_d2i(x, NID_subject_alt_name, NULL, NULL));
  if (gens) {
    for (size_t i = 0; i < sk_GENERAL_NAME_num(gens); i++) {
      const GENERAL_NAME *gen = sk_GENERAL_NAME_value(gens, i);
      if (gen->type != check_type) {
        continue;
      }
      const ASN1_STRING *cstr;
      if (check_type == GEN_EMAIL) {
        cstr = gen->d.rfc822Name;
      } else if (check_type == GEN_DNS) {
        cstr = gen->d.dNSName;
      } else {
        cstr = gen->d.iPAddress;
      }
      // Positive on success, negative on error!
      if ((rv = do_check_string(cstr, alt_type, equal, flags, check_type, chk,
                                chklen, peername)) != 0) {
        break;
      }
    }
    GENERAL_NAMES_free(gens);
    return rv;
  }

  // We're done if CN-ID is not pertinent
  if (cnid == NID_undef || (flags & X509_CHECK_FLAG_NEVER_CHECK_SUBJECT)) {
    return 0;
  }

  int j = -1;
  const X509_NAME *name = X509_get_subject_name(x);
  while ((j = X509_NAME_get_index_by_NID(name, cnid, j)) >= 0) {
    const X509_NAME_ENTRY *ne = X509_NAME_get_entry(name, j);
    const ASN1_STRING *str = X509_NAME_ENTRY_get_data(ne);
    // Positive on success, negative on error!
    if ((rv = do_check_string(str, -1, equal, flags, check_type, chk, chklen,
                              peername)) != 0) {
      return rv;
    }
  }
  return 0;
}